

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O1

void __thiscall crsGA::Logger::startProcessingMessages(Logger *this)

{
  thread local_28;
  Logger *local_20;
  code *local_18;
  undefined8 local_10;
  
  LOCK();
  (this->_exit)._M_base._M_i = false;
  UNLOCK();
  local_18 = processEntries;
  local_10 = 0;
  local_20 = this;
  std::thread::thread<void(crsGA::Logger::*)(),crsGA::Logger*,void>
            (&local_28,(offset_in_Logger_to_subr *)&local_18,&local_20);
  if ((this->_thread)._M_id._M_thread == 0) {
    (this->_thread)._M_id._M_thread = (native_handle_type)local_28._M_id._M_thread;
    return;
  }
  std::terminate();
}

Assistant:

void Logger::startProcessingMessages()
{
    _exit = false;
    _thread = std::thread(&Logger::processEntries, this);
}